

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall
pstore::file::range_lock::range_lock
          (range_lock *this,file_base *file,uint64_t offset,size_t size,lock_kind kind)

{
  lock_kind kind_local;
  size_t size_local;
  uint64_t offset_local;
  file_base *file_local;
  range_lock *this_local;
  
  this->file_ = file;
  this->offset_ = offset;
  this->size_ = size;
  this->kind_ = kind;
  this->locked_ = false;
  return;
}

Assistant:

range_lock::range_lock (file_base * const file, std::uint64_t const offset,
                                std::size_t const size, file_base::lock_kind const kind) noexcept
                : file_{file}
                , offset_{offset}
                , size_{size}
                , kind_{kind} {}